

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

uint ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(DataStream *is)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  error_code *this;
  long in_FS_OFFSET;
  uchar chData;
  uint n;
  CheckVarIntMode<(VarIntMode)0,_unsigned_int> *in_stack_ffffffffffffff68;
  io_errc in_stack_ffffffffffffff74;
  error_code *in_stack_ffffffffffffff78;
  DataStream *in_stack_ffffffffffffff80;
  error_code *peVar5;
  uint local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckVarIntMode<(VarIntMode)0,_unsigned_int>::CheckVarIntMode(in_stack_ffffffffffffff68);
  local_3c = 0;
  do {
    bVar2 = ser_readdata8<DataStream>(in_stack_ffffffffffffff80);
    uVar3 = std::numeric_limits<unsigned_int>::max();
    if (uVar3 >> 7 < local_3c) {
      pcVar4 = (char *)__cxa_allocate_exception(0x20);
      std::error_code::error_code<std::io_errc,void>
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar4,(error_code *)"ReadVarInt(): size too large");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
LAB_003994ec:
      __stack_chk_fail();
    }
    local_3c = local_3c << 7 | bVar2 & 0x7f;
    if ((bVar2 & 0x80) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_3c;
      }
      goto LAB_003994ec;
    }
    uVar3 = std::numeric_limits<unsigned_int>::max();
    if (local_3c == uVar3) {
      this = (error_code *)__cxa_allocate_exception(0x20);
      peVar5 = this;
      std::error_code::error_code<std::io_errc,void>(this,in_stack_ffffffffffffff74);
      std::ios_base::failure[abi:cxx11]::failure
                ((char *)peVar5,(error_code *)"ReadVarInt(): size too large");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(this,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_003994ec;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

I ReadVarInt(Stream& is)
{
    CheckVarIntMode<Mode, I>();
    I n = 0;
    while(true) {
        unsigned char chData = ser_readdata8(is);
        if (n > (std::numeric_limits<I>::max() >> 7)) {
           throw std::ios_base::failure("ReadVarInt(): size too large");
        }
        n = (n << 7) | (chData & 0x7F);
        if (chData & 0x80) {
            if (n == std::numeric_limits<I>::max()) {
                throw std::ios_base::failure("ReadVarInt(): size too large");
            }
            n++;
        } else {
            return n;
        }
    }
}